

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

void __thiscall amrex::MLCellLinOp::defineBC(MLCellLinOp *this)

{
  DistributionMapping *pDVar1;
  Geometry *pGVar2;
  long *plVar3;
  pointer puVar4;
  tuple<amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_> tVar5;
  pointer puVar6;
  tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_> tVar7;
  long lVar8;
  long lVar9;
  pointer puVar10;
  BndryCondLoc *__ptr;
  MLCellLinOp *pMVar11;
  int _ncomp;
  int iVar12;
  MLMGBndry *this_00;
  __uniq_ptr_data<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>,_true,_true>
  _Var13;
  __uniq_ptr_data<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>,_true,_true> _Var14;
  BndryCondLoc *this_01;
  pointer piVar15;
  long lVar16;
  size_type __new_size;
  BoxArray *pBVar17;
  pointer __p;
  long lVar18;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  *pVVar19;
  long lVar20;
  allocator_type local_231;
  Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  *local_230;
  MLCellLinOp *local_228;
  Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  *local_220;
  BoxArray *local_218;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  *local_210;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  bclohi;
  RealVect local_1d8;
  Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
  *local_1b8;
  BoxArray cba;
  IntVect local_f0;
  int local_e4;
  
  _ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  local_218 = (BoxArray *)&this->m_bndry_sol;
  std::
  vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
            *)local_218,(long)(this->super_MLLinOp).m_num_amr_levels);
  local_220 = &this->m_crse_sol_br;
  std::
  vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::resize(&local_220->
            super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  local_210 = &this->m_bndry_cor;
  std::
  vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::resize(&local_210->
            super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  local_230 = &this->m_crse_cor_br;
  std::
  vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::resize(&local_230->
            super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::resize(&(this->m_robin_bcval).
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  iVar12 = (this->super_MLLinOp).m_num_amr_levels;
  local_228 = this;
  if (0 < iVar12) {
    lVar16 = 0;
    lVar18 = 0;
    do {
      pBVar17 = *(BoxArray **)
                 ((long)&(((local_228->super_MLLinOp).m_grids.
                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar16);
      pDVar1 = *(DistributionMapping **)
                ((long)&(((local_228->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar16);
      pGVar2 = *(Geometry **)
                ((long)&(((local_228->super_MLLinOp).m_geom.
                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar16);
      this_00 = (MLMGBndry *)operator_new(0xc78);
      MLMGBndry::MLMGBndry(this_00,pBVar17,pDVar1,_ncomp,pGVar2);
      plVar3 = *(long **)(*(long *)&local_218->m_bat + lVar18 * 8);
      *(MLMGBndry **)(*(long *)&local_218->m_bat + lVar18 * 8) = this_00;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
      lVar18 = lVar18 + 1;
      iVar12 = (local_228->super_MLLinOp).m_num_amr_levels;
      lVar16 = lVar16 + 0x18;
    } while (lVar18 < iVar12);
    this = local_228;
    if (1 < iVar12) {
      lVar16 = 1;
      lVar18 = 6;
      do {
        pMVar11 = local_228;
        iVar12 = (local_228->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar16 + -1];
        BoxArray::BoxArray(&cba,*(BoxArray **)
                                 ((long)&(((local_228->super_MLLinOp).m_grids.
                                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ).
                                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4));
        BoxArray::coarsen(&cba,iVar12);
        pDVar1 = *(DistributionMapping **)
                  ((long)&(((pMVar11->super_MLLinOp).m_dmap.
                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
        _Var13.
        super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>._M_t
        .super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>.
        super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>)
             operator_new(0x970);
        BndryRegister::BndryRegister
                  ((BndryRegister *)
                   _Var13.
                   super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                   .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl,&cba,pDVar1,0,
                   1,2,_ncomp);
        puVar4 = (local_220->
                 super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar5.
        super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>.
        super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
               *)&puVar4[lVar16]._M_t.
                  super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
        ;
        puVar4[lVar16]._M_t.
        super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> =
             _Var13.
             super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
             .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl;
        if (tVar5.
            super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
            .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::BndryRegister_*,_false>)0x0) {
          (**(code **)(*(long *)tVar5.
                                super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                                .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl +
                      8))();
        }
        BoxArray::~BoxArray(&cba);
        lVar16 = lVar16 + 1;
        iVar12 = (local_228->super_MLLinOp).m_num_amr_levels;
        lVar18 = lVar18 + 6;
      } while (lVar16 < iVar12);
      this = local_228;
      if (1 < iVar12) {
        lVar16 = 1;
        lVar18 = 6;
        do {
          iVar12 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar16 + -1];
          BoxArray::BoxArray(&cba,*(BoxArray **)
                                   ((long)&(((local_228->super_MLLinOp).m_grids.
                                             super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                             .
                                             super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                           ).
                                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4));
          this = local_228;
          BoxArray::coarsen(&cba,iVar12);
          pDVar1 = *(DistributionMapping **)
                    ((long)&(((this->super_MLLinOp).m_dmap.
                              super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ).
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
          _Var13.
          super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>.
          _M_t.
          super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
          .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl =
               (__uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>)
               operator_new(0x970);
          BndryRegister::BndryRegister
                    ((BndryRegister *)
                     _Var13.
                     super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                     .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl,&cba,pDVar1,
                     0,1,2,_ncomp);
          puVar4 = (local_230->
                   super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          tVar5.
          super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
          .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                 *)&puVar4[lVar16]._M_t.
                    super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
          ;
          puVar4[lVar16]._M_t.
          super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> =
               _Var13.
               super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
               .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl;
          if (tVar5.
              super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
              .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl !=
              (_Head_base<0UL,_amrex::BndryRegister_*,_false>)0x0) {
            (**(code **)(*(long *)tVar5.
                                  super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                                  .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl
                        + 8))();
          }
          BndryRegister::setVal
                    ((BndryRegister *)
                     (local_230->
                     super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                     ).
                     super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                     super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
                     ,0.0);
          BoxArray::~BoxArray(&cba);
          lVar16 = lVar16 + 1;
          iVar12 = (this->super_MLLinOp).m_num_amr_levels;
          lVar18 = lVar18 + 6;
        } while (lVar16 < iVar12);
        if (1 < iVar12) {
          local_230 = (Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                       *)(long)_ncomp;
          lVar16 = 1;
          lVar18 = 6;
          do {
            local_218 = *(BoxArray **)
                         ((long)&(((this->super_MLLinOp).m_grids.
                                   super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
            local_220 = *(Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                          **)((long)&(((this->super_MLLinOp).m_dmap.
                                       super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                     ).
                                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
            pGVar2 = *(Geometry **)
                      ((long)&(((this->super_MLLinOp).m_geom.
                                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
            _Var14.super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>.
            _M_t.super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
            super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>)
                 operator_new(0xc78);
            MLMGBndry::MLMGBndry
                      ((MLMGBndry *)
                       _Var14.
                       super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                       .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl,local_218,
                       (DistributionMapping *)local_220,_ncomp,pGVar2);
            puVar6 = (local_210->
                     super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                     ).
                     super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            tVar7.super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
            .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
                 *(_Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_> *)
                  &puVar6[lVar16]._M_t.
                   super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>;
            puVar6[lVar16]._M_t.
            super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> =
                 _Var14.
                 super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
                 super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl;
            if (tVar7.
                super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
                super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl !=
                (_Head_base<0UL,_amrex::MLMGBndry_*,_false>)0x0) {
              (**(code **)(*(long *)tVar7.
                                    super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                                    .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl +
                          8))();
            }
            this = local_228;
            bclohi.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
            bclohi.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            bclohi.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1d8.vect[0] = (Real)&PTR__FabFactory_00712918;
            MultiFab::MultiFab((MultiFab *)&cba,
                               *(BoxArray **)
                                ((long)&(((local_228->super_MLLinOp).m_grids.
                                          super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                        ).
                                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4),
                               *(DistributionMapping **)
                                ((long)&(((local_228->super_MLLinOp).m_dmap.
                                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                        ).
                                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4),
                               _ncomp,1,(MFInfo *)&bclohi,(FabFactory<amrex::FArrayBox> *)&local_1d8
                              );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&bclohi.
                          super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)&cba,0.0,0,local_e4,&local_f0);
            _Var14.super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>.
            _M_t.super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
            super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
                 (this->m_bndry_cor).
                 super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                 super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>;
            bclohi.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0xfffffd66fffffd66;
            bclohi.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xfffffd66fffffd66;
            bclohi.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xfffffd66fffffd66;
            (**(code **)(*(long *)_Var14.
                                  super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                                  .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl +
                        0x38))(_Var14.
                               super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                               .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl,
                               (tuple<amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
                                )(this->m_crse_cor_br).
                                 super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                                 super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
                               ,0,(FabArray<amrex::FArrayBox> *)&cba,0,0,_ncomp,
                               (this->super_MLLinOp).m_amr_ref_ratio.
                               super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar16 + -1],(MFInfo *)&bclohi,
                               InterpBndryData::IBD_max_order_DEF);
            local_1d8.vect[0] = 2.14321574937393e-312;
            local_1d8.vect[1] = (Real)CONCAT44(local_1d8.vect[1]._4_4_,0x65);
            std::
            vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)&bclohi,(size_type)local_230,(value_type *)&local_1d8,&local_231);
            local_1d8.vect[0] = 0.0;
            local_1d8.vect[1] = 0.0;
            local_1d8.vect[2] = 0.0;
            MLMGBndry::setLOBndryConds
                      ((MLMGBndry *)
                       (this->m_bndry_cor).
                       super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar16]._M_t.
                       super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>
                       ,&bclohi,&bclohi,
                       (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>
                       .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar16 + -1],&local_1d8);
            if (bclohi.
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                .
                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(bclohi.
                              super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)bclohi.
                                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                    .
                                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)bclohi.
                                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                    .
                                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            MultiFab::~MultiFab((MultiFab *)&cba);
            lVar16 = lVar16 + 1;
            __new_size = (size_type)(this->super_MLLinOp).m_num_amr_levels;
            lVar18 = lVar18 + 6;
          } while (lVar16 < (long)__new_size);
          goto LAB_00541bdf;
        }
      }
    }
  }
  __new_size = (size_type)iVar12;
LAB_00541bdf:
  local_1b8 = &this->m_bcondloc;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
  ::resize(&local_1b8->
            super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
           ,__new_size);
  if (0 < (this->super_MLLinOp).m_num_amr_levels) {
    piVar15 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    pVVar19 = (Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
               *)0x0;
    do {
      local_220 = (Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                   *)((long)pVVar19 * 3);
      std::
      vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
      ::resize(&(this->m_bcondloc).
                super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)pVVar19].
                super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
               ,(long)piVar15[(long)pVVar19]);
      piVar15 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (0 < piVar15[(long)pVVar19]) {
        local_230 = (Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                     *)((long)pVVar19 * 0x18);
        lVar16 = 0;
        pBVar17 = (BoxArray *)0x0;
        lVar20 = 0;
        lVar18 = 0;
        local_210 = pVVar19;
        do {
          lVar8 = *(long *)((long)&(local_230->
                                   super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                                   ).
                                   super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (long)(this->super_MLLinOp).m_grids.
                                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          lVar9 = *(long *)((long)&(local_230->
                                   super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                                   ).
                                   super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (long)(this->super_MLLinOp).m_dmap.
                                 super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          local_218 = pBVar17;
          this_01 = (BndryCondLoc *)operator_new(0x350);
          BndryCondLoc::BndryCondLoc
                    (this_01,(BoxArray *)(lVar8 + lVar20),
                     (DistributionMapping *)
                     ((long)&(((_Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                                *)&(pBVar17->m_bat).m_bat_type)->_M_impl).super__Vector_impl_data.
                             _M_start + lVar9),_ncomp);
          puVar10 = (&(((local_1b8->
                        super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                        ).
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                      ).
                      super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)[(long)local_220];
          cba.m_bat._0_8_ = 0;
          __ptr = *(BndryCondLoc **)
                   ((long)&(puVar10->_M_t).
                           super___uniq_ptr_impl<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::MLCellLinOp::BndryCondLoc_*,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                           .super__Head_base<0UL,_amrex::MLCellLinOp::BndryCondLoc_*,_false>.
                           _M_head_impl + lVar16);
          *(BndryCondLoc **)
           ((long)&(puVar10->_M_t).
                   super___uniq_ptr_impl<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::MLCellLinOp::BndryCondLoc_*,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                   .super__Head_base<0UL,_amrex::MLCellLinOp::BndryCondLoc_*,_false>._M_head_impl +
           lVar16) = this_01;
          if (__ptr != (BndryCondLoc *)0x0) {
            std::default_delete<amrex::MLCellLinOp::BndryCondLoc>::operator()
                      ((default_delete<amrex::MLCellLinOp::BndryCondLoc> *)
                       ((long)&(puVar10->_M_t).
                               super___uniq_ptr_impl<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::MLCellLinOp::BndryCondLoc_*,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                               .super__Head_base<0UL,_amrex::MLCellLinOp::BndryCondLoc_*,_false>.
                               _M_head_impl + lVar16),__ptr);
          }
          pVVar19 = local_210;
          this = local_228;
          if (cba.m_bat._0_8_ != 0) {
            std::default_delete<amrex::MLCellLinOp::BndryCondLoc>::operator()
                      ((default_delete<amrex::MLCellLinOp::BndryCondLoc> *)&cba,
                       (BndryCondLoc *)cba.m_bat._0_8_);
          }
          lVar18 = lVar18 + 1;
          piVar15 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          lVar20 = lVar20 + 0x68;
          pBVar17 = (BoxArray *)((local_218->m_bat).m_op.m_bndryReg.m_crse_ratio.vect + 1);
          lVar16 = lVar16 + 8;
        } while (lVar18 < piVar15[(long)pVVar19]);
      }
      pVVar19 = (Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                 *)((long)&(pVVar19->
                           super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                           ).
                           super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
    } while ((long)pVVar19 < (long)(this->super_MLLinOp).m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLCellLinOp::defineBC ()
{
    BL_PROFILE("MLCellLinOp::defineBC()");

    const int ncomp = getNComp();

    m_bndry_sol.resize(m_num_amr_levels);
    m_crse_sol_br.resize(m_num_amr_levels);

    m_bndry_cor.resize(m_num_amr_levels);
    m_crse_cor_br.resize(m_num_amr_levels);

    m_robin_bcval.resize(m_num_amr_levels);

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bndry_sol[amrlev] = std::make_unique<MLMGBndry>(m_grids[amrlev][0], m_dmap[amrlev][0],
                                                          ncomp, m_geom[amrlev][0]);
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        const int in_rad = 0;
        const int out_rad = 1;
        const int extent_rad = 2;
        const int crse_ratio = m_amr_ref_ratio[amrlev-1];
        BoxArray cba = m_grids[amrlev][0];
        cba.coarsen(crse_ratio);
        m_crse_sol_br[amrlev] = std::make_unique<BndryRegister>
            (cba, m_dmap[amrlev][0], in_rad, out_rad, extent_rad, ncomp);
    }

    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        const int in_rad = 0;
        const int out_rad = 1;
        const int extent_rad = 2;
        const int crse_ratio = m_amr_ref_ratio[amrlev-1];
        BoxArray cba = m_grids[amrlev][0];
        cba.coarsen(crse_ratio);
        m_crse_cor_br[amrlev] = std::make_unique<BndryRegister>
            (cba, m_dmap[amrlev][0], in_rad, out_rad, extent_rad, ncomp);
        m_crse_cor_br[amrlev]->setVal(0.0);
    }

    // This has be to done after m_crse_cor_br is defined.
    for (int amrlev = 1; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bndry_cor[amrlev] = std::make_unique<MLMGBndry>(m_grids[amrlev][0], m_dmap[amrlev][0],
                                                          ncomp, m_geom[amrlev][0]);
        MultiFab bc_data(m_grids[amrlev][0], m_dmap[amrlev][0], ncomp, 1);
        bc_data.setVal(0.0);

        m_bndry_cor[amrlev]->setBndryValues(*m_crse_cor_br[amrlev], 0, bc_data, 0, 0, ncomp,
                                            m_amr_ref_ratio[amrlev-1], BCRec());

        Vector<Array<LinOpBCType,AMREX_SPACEDIM> > bclohi
            (ncomp,Array<LinOpBCType,AMREX_SPACEDIM>{{AMREX_D_DECL(BCType::Dirichlet,
                                                                   BCType::Dirichlet,
                                                                   BCType::Dirichlet)}});
        m_bndry_cor[amrlev]->setLOBndryConds(bclohi, bclohi, m_amr_ref_ratio[amrlev-1], RealVect{});
    }

    m_bcondloc.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_bcondloc[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_bcondloc[amrlev][mglev] = std::make_unique<BndryCondLoc>(m_grids[amrlev][mglev],
                                                                       m_dmap[amrlev][mglev],
                                                                       ncomp);
        }
    }
}